

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Track::GetFirst(Track *this,BlockEntry **pBlockEntry)

{
  int iVar1;
  BlockEntry *in_RAX;
  Cluster *this_00;
  long lVar2;
  undefined4 extraout_var;
  int iVar3;
  int iVar4;
  long unaff_R15;
  bool bVar5;
  BlockEntry *pNextEntry;
  BlockEntry *local_38;
  
  local_38 = in_RAX;
  this_00 = Segment::GetFirst(this->m_pSegment);
  iVar3 = 0;
  do {
    if (this_00->m_pSegment == (Segment *)0x0) {
      bVar5 = Segment::DoneParsing(this->m_pSegment);
      if (!bVar5) {
        *pBlockEntry = (BlockEntry *)0x0;
        lVar2 = -3;
        goto LAB_00112d76;
      }
      break;
    }
    lVar2 = Cluster::GetFirst(this_00,pBlockEntry);
    if (lVar2 < 0) {
      iVar1 = 1;
    }
    else if (*pBlockEntry == (BlockEntry *)0x0) {
      lVar2 = unaff_R15;
      iVar4 = 3;
LAB_00112d20:
      iVar1 = iVar4;
      this_00 = Segment::GetNext(this->m_pSegment,this_00);
    }
    else {
      do {
        iVar1 = (*(*pBlockEntry)->_vptr_BlockEntry[2])();
        if (CONCAT44(extraout_var,iVar1) == 0) {
          __assert_fail("pBlock",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x124f,"long mkvparser::Track::GetFirst(const BlockEntry *&) const");
        }
        if ((*(long *)(CONCAT44(extraout_var,iVar1) + 0x10) == (this->m_info).number) &&
           (iVar1 = (*this->_vptr_Track[2])(this,*pBlockEntry), (char)iVar1 != '\0')) {
          iVar1 = 1;
          lVar2 = 0;
        }
        else {
          lVar2 = Cluster::GetNext(this_00,*pBlockEntry,&local_38);
          if (lVar2 < 0) {
            iVar1 = 1;
          }
          else {
            lVar2 = unaff_R15;
            if (local_38 == (BlockEntry *)0x0) {
              iVar1 = 4;
            }
            else {
              *pBlockEntry = local_38;
              iVar1 = 0;
            }
          }
        }
        unaff_R15 = lVar2;
      } while (iVar1 == 0);
      if (iVar1 == 4) {
        iVar4 = iVar3 + 1;
        iVar1 = 2;
        bVar5 = iVar3 < 99;
        iVar3 = iVar4;
        iVar4 = 0;
        if (bVar5) goto LAB_00112d20;
      }
    }
    if ((iVar1 != 3) && (iVar1 != 0)) {
      bVar5 = iVar1 == 2;
      goto LAB_00112d80;
    }
    unaff_R15 = lVar2;
  } while (this_00 != (Cluster *)0x0);
  *pBlockEntry = &(this->m_eos).super_BlockEntry;
  lVar2 = 1;
LAB_00112d76:
  bVar5 = false;
LAB_00112d80:
  if (bVar5) {
    *pBlockEntry = &(this->m_eos).super_BlockEntry;
    lVar2 = 1;
  }
  return lVar2;
}

Assistant:

long Track::GetFirst(const BlockEntry*& pBlockEntry) const {
  const Cluster* pCluster = m_pSegment->GetFirst();

  for (int i = 0;;) {
    if (pCluster == NULL) {
      pBlockEntry = GetEOS();
      return 1;
    }

    if (pCluster->EOS()) {
      if (m_pSegment->DoneParsing()) {
        pBlockEntry = GetEOS();
        return 1;
      }

      pBlockEntry = 0;
      return E_BUFFER_NOT_FULL;
    }

    long status = pCluster->GetFirst(pBlockEntry);

    if (status < 0)  // error
      return status;

    if (pBlockEntry == 0) {  // empty cluster
      pCluster = m_pSegment->GetNext(pCluster);
      continue;
    }

    for (;;) {
      const Block* const pBlock = pBlockEntry->GetBlock();
      assert(pBlock);

      const long long tn = pBlock->GetTrackNumber();

      if ((tn == m_info.number) && VetEntry(pBlockEntry))
        return 0;

      const BlockEntry* pNextEntry;

      status = pCluster->GetNext(pBlockEntry, pNextEntry);

      if (status < 0)  // error
        return status;

      if (pNextEntry == 0)
        break;

      pBlockEntry = pNextEntry;
    }

    ++i;

    if (i >= 100)
      break;

    pCluster = m_pSegment->GetNext(pCluster);
  }

  // NOTE: if we get here, it means that we didn't find a block with
  // a matching track number.  We interpret that as an error (which
  // might be too conservative).

  pBlockEntry = GetEOS();  // so we can return a non-NULL value
  return 1;
}